

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O0

void FIX::deleteSession(string *sender,string *target)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *target_local;
  string *sender_local;
  
  local_18 = target;
  target_local = sender;
  std::operator+(&local_98,"store/FIX.4.2-",sender);
  std::operator+(&local_78,&local_98,"-");
  std::operator+(&local_58,&local_78,target);
  std::operator+(&local_38,&local_58,".messages");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::operator+(&local_128,"store/FIX.4.2-",sender);
  std::operator+(&local_108,&local_128,"-");
  std::operator+(&local_e8,&local_108,target);
  std::operator+(&local_c8,&local_e8,".header");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::operator+(&local_1a8,"store/FIX.4.2-",sender);
  std::operator+(&local_188,&local_1a8,"-");
  std::operator+(&local_168,&local_188,target);
  std::operator+(&local_148,&local_168,".seqnums");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::operator+(&local_228,"store/FIX.4.2-",sender);
  std::operator+(&local_208,&local_228,"-");
  std::operator+(&local_1e8,&local_208,target);
  std::operator+(&local_1c8,&local_1e8,".session");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FIX::file_unlink(pcVar1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  return;
}

Assistant:

inline void deleteSession( std::string sender, std::string target )
{
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".messages" ).c_str() );
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".header" ).c_str() );
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".seqnums" ).c_str() );
  file_unlink( ( "store/FIX.4.2-" + sender + "-" + target + ".session" ).c_str() );
}